

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_max_gap(REF_GRID ref_grid,REF_DBL *max_gap)

{
  REF_MPI ref_mpi;
  REF_NODE pRVar1;
  REF_GEOM ref_geom;
  REF_DBL *pRVar2;
  uint uVar3;
  undefined8 uVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  double local_78;
  REF_DBL global_max;
  REF_DBL xyz [3];
  
  ref_mpi = ref_grid->mpi;
  pRVar1 = ref_grid->node;
  ref_geom = ref_grid->geom;
  *max_gap = 0.0;
  if (ref_geom->model == (void *)0x0) {
LAB_00143eaa:
    uVar3 = 0;
  }
  else {
    local_78 = 0.0;
    dVar9 = 0.0;
    lVar6 = 0;
    for (lVar7 = 0; lVar7 < ref_geom->max; lVar7 = lVar7 + 1) {
      if ((*(int *)((long)ref_geom->descr + lVar6) == 0) &&
         (lVar8 = (long)*(int *)((long)ref_geom->descr + lVar6 + 0x14),
         ref_mpi->id == pRVar1->part[lVar8])) {
        uVar3 = ref_egads_eval(ref_geom,(REF_INT)lVar7,xyz,(REF_DBL *)0x0);
        if (uVar3 != 0) {
          pcVar5 = "eval xyz";
          uVar4 = 0x727;
          goto LAB_00143ed1;
        }
        pRVar2 = pRVar1->real;
        dVar10 = SQRT((xyz[2] - pRVar2[lVar8 * 0xf + 2]) * (xyz[2] - pRVar2[lVar8 * 0xf + 2]) +
                      (xyz[1] - pRVar2[lVar8 * 0xf + 1]) * (xyz[1] - pRVar2[lVar8 * 0xf + 1]) +
                      (xyz[0] - pRVar2[lVar8 * 0xf]) * (xyz[0] - pRVar2[lVar8 * 0xf]));
        local_78 = dVar9;
        if (dVar9 <= dVar10) {
          dVar9 = dVar10;
          local_78 = dVar10;
        }
      }
      lVar6 = lVar6 + 0x18;
    }
    uVar3 = ref_mpi_max(ref_mpi,&local_78,&global_max,3);
    if (uVar3 == 0) {
      dVar9 = *max_gap;
      if (*max_gap <= global_max) {
        dVar9 = global_max;
      }
      *max_gap = dVar9;
      local_78 = 0.0;
      lVar6 = 0;
      for (lVar7 = 0; lVar7 < ref_geom->max; lVar7 = lVar7 + 1) {
        if ((*(int *)((long)ref_geom->descr + lVar6) == 1) &&
           (lVar8 = (long)*(int *)((long)ref_geom->descr + lVar6 + 0x14),
           ref_mpi->id == pRVar1->part[lVar8])) {
          uVar3 = ref_egads_eval(ref_geom,(REF_INT)lVar7,xyz,(REF_DBL *)0x0);
          if (uVar3 != 0) {
            pcVar5 = "eval xyz";
            uVar4 = 0x735;
            goto LAB_00143ed1;
          }
          pRVar2 = pRVar1->real;
          dVar9 = SQRT((xyz[2] - pRVar2[lVar8 * 0xf + 2]) * (xyz[2] - pRVar2[lVar8 * 0xf + 2]) +
                       (xyz[1] - pRVar2[lVar8 * 0xf + 1]) * (xyz[1] - pRVar2[lVar8 * 0xf + 1]) +
                       (xyz[0] - pRVar2[lVar8 * 0xf]) * (xyz[0] - pRVar2[lVar8 * 0xf]));
          if (local_78 <= dVar9) {
            local_78 = dVar9;
          }
        }
        lVar6 = lVar6 + 0x18;
      }
      uVar3 = ref_mpi_max(ref_mpi,&local_78,&global_max,3);
      if (uVar3 == 0) {
        dVar9 = *max_gap;
        if (*max_gap <= global_max) {
          dVar9 = global_max;
        }
        *max_gap = dVar9;
        local_78 = 0.0;
        lVar6 = 0;
        for (lVar7 = 0; lVar7 < ref_geom->max; lVar7 = lVar7 + 1) {
          if ((*(int *)((long)ref_geom->descr + lVar6) == 2) &&
             (lVar8 = (long)*(int *)((long)ref_geom->descr + lVar6 + 0x14),
             ref_mpi->id == pRVar1->part[lVar8])) {
            uVar3 = ref_egads_eval(ref_geom,(REF_INT)lVar7,xyz,(REF_DBL *)0x0);
            if (uVar3 != 0) {
              pcVar5 = "eval xyz";
              uVar4 = 0x743;
              goto LAB_00143ed1;
            }
            pRVar2 = pRVar1->real;
            dVar9 = SQRT((xyz[2] - pRVar2[lVar8 * 0xf + 2]) * (xyz[2] - pRVar2[lVar8 * 0xf + 2]) +
                         (xyz[1] - pRVar2[lVar8 * 0xf + 1]) * (xyz[1] - pRVar2[lVar8 * 0xf + 1]) +
                         (xyz[0] - pRVar2[lVar8 * 0xf]) * (xyz[0] - pRVar2[lVar8 * 0xf]));
            if (local_78 <= dVar9) {
              local_78 = dVar9;
            }
          }
          lVar6 = lVar6 + 0x18;
        }
        uVar3 = ref_mpi_max(ref_mpi,&local_78,&global_max,3);
        if (uVar3 == 0) {
          local_78 = global_max;
          dVar9 = *max_gap;
          if (*max_gap <= global_max) {
            dVar9 = global_max;
          }
          *max_gap = dVar9;
          uVar3 = ref_mpi_bcast(ref_mpi,max_gap,1,3);
          if (uVar3 == 0) goto LAB_00143eaa;
          pcVar5 = "mpi bcast gap";
          uVar4 = 0x74c;
        }
        else {
          pcVar5 = "mpi max face";
          uVar4 = 0x749;
        }
      }
      else {
        pcVar5 = "mpi max edge";
        uVar4 = 0x73b;
      }
    }
    else {
      pcVar5 = "mpi max node";
      uVar4 = 0x72d;
    }
LAB_00143ed1:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar4,
           "ref_geom_max_gap",(ulong)uVar3,pcVar5);
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_geom_max_gap(REF_GRID ref_grid, REF_DBL *max_gap) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT geom;
  REF_INT node;
  REF_DBL xyz[3];
  REF_DBL dist, max, global_max;

  *max_gap = 0.0;

  if (!ref_geom_model_loaded(ref_geom)) return REF_SUCCESS;

  max = 0.0;
  each_ref_geom_node(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) continue;
    RSS(ref_egads_eval(ref_geom, geom, xyz, NULL), "eval xyz");
    dist = sqrt(pow(xyz[0] - ref_node_xyz(ref_node, 0, node), 2) +
                pow(xyz[1] - ref_node_xyz(ref_node, 1, node), 2) +
                pow(xyz[2] - ref_node_xyz(ref_node, 2, node), 2));
    max = MAX(max, dist);
  }
  RSS(ref_mpi_max(ref_mpi, &max, &global_max, REF_DBL_TYPE), "mpi max node");
  max = global_max;
  *max_gap = MAX(*max_gap, max);

  max = 0.0;
  each_ref_geom_edge(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) continue;
    RSS(ref_egads_eval(ref_geom, geom, xyz, NULL), "eval xyz");
    dist = sqrt(pow(xyz[0] - ref_node_xyz(ref_node, 0, node), 2) +
                pow(xyz[1] - ref_node_xyz(ref_node, 1, node), 2) +
                pow(xyz[2] - ref_node_xyz(ref_node, 2, node), 2));
    max = MAX(max, dist);
  }
  RSS(ref_mpi_max(ref_mpi, &max, &global_max, REF_DBL_TYPE), "mpi max edge");
  max = global_max;
  *max_gap = MAX(*max_gap, max);

  max = 0.0;
  each_ref_geom_face(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) continue;
    RSS(ref_egads_eval(ref_geom, geom, xyz, NULL), "eval xyz");
    dist = sqrt(pow(xyz[0] - ref_node_xyz(ref_node, 0, node), 2) +
                pow(xyz[1] - ref_node_xyz(ref_node, 1, node), 2) +
                pow(xyz[2] - ref_node_xyz(ref_node, 2, node), 2));
    max = MAX(max, dist);
  }
  RSS(ref_mpi_max(ref_mpi, &max, &global_max, REF_DBL_TYPE), "mpi max face");
  max = global_max;
  *max_gap = MAX(*max_gap, max);
  RSS(ref_mpi_bcast(ref_mpi, max_gap, 1, REF_DBL_TYPE), "mpi bcast gap");

  return REF_SUCCESS;
}